

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

ostream * s2pred::operator<<(ostream *os,Excluded excluded)

{
  ostream *poVar1;
  
  if (excluded < 4) {
    poVar1 = std::operator<<(os,&DAT_002b3638 + *(int *)(&DAT_002b3638 + (ulong)excluded * 4));
    return poVar1;
  }
  poVar1 = std::operator<<(os,"Unknown enum value");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Excluded excluded) {
  switch (excluded) {
    case Excluded::FIRST: return os << "FIRST";
    case Excluded::SECOND: return os << "SECOND";
    case Excluded::NEITHER: return os << "NEITHER";
    case Excluded::UNCERTAIN: return os << "UNCERTAIN";
    default: return os << "Unknown enum value";
  }
}